

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O3

void Abc_WriteKLut(FILE *pFile,int nLutSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *__format;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar3 = 1 << ((byte)nLutSize & 0x1f);
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,".model lut%d\n",(ulong)(uint)nLutSize);
  fwrite(".inputs",7,1,(FILE *)pFile);
  if (nLutSize != 0x1f) {
    uVar7 = 1;
    if (1 < (int)uVar3) {
      uVar7 = uVar3;
    }
    uVar9 = 0;
    do {
      fprintf((FILE *)pFile," p%02d",uVar9);
      uVar6 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar6;
    } while (uVar7 != uVar6);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".inputs",7,1,(FILE *)pFile);
  if (0 < nLutSize) {
    uVar9 = 0;
    do {
      fprintf((FILE *)pFile," i%d",uVar9);
      uVar7 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar7;
    } while (nLutSize != uVar7);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".outputs o\n",0xb,1,(FILE *)pFile);
  fwrite(".names n01 o\n",0xd,1,(FILE *)pFile);
  fwrite("1 1\n",4,1,(FILE *)pFile);
  if (1 < (int)uVar3) {
    uVar5 = 3;
    uVar8 = 3 - (uVar3 & 0xfffffffe);
    uVar7 = 2;
    uVar6 = 1;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + (uVar6 == uVar7);
      uVar7 = uVar7 << (uVar6 == uVar7);
      if (uVar4 == nLutSize - 1U) {
        __format = ".names i%d p%02d p%02d n%02d\n";
        uVar1 = nLutSize - 1U;
        uVar2 = uVar8;
      }
      else {
        __format = ".names i%d n%02d n%02d n%02d\n";
        uVar1 = uVar4;
        uVar2 = uVar5;
      }
      fprintf((FILE *)pFile,__format,(ulong)uVar1,(ulong)(uVar2 - 1),(ulong)uVar2,(ulong)uVar6);
      fwrite("01- 1\n",6,1,(FILE *)pFile);
      fwrite("1-1 1\n",6,1,(FILE *)pFile);
      uVar6 = uVar6 + 1;
      uVar8 = uVar8 + 2;
      uVar5 = uVar5 + 2;
    } while (uVar3 != uVar6);
  }
  fwrite(".end\n",5,1,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Abc_WriteKLut( FILE * pFile, int nLutSize )
{
    int i, iVar, iNext, nPars = (1 << nLutSize);
    fprintf( pFile, "\n" ); 
    fprintf( pFile, ".model lut%d\n", nLutSize );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nPars; i++ )
        fprintf( pFile, " p%02d", i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nLutSize; i++ )
        fprintf( pFile, " i%d", i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs o\n" ); 
    fprintf( pFile, ".names n01 o\n" ); 
    fprintf( pFile, "1 1\n" ); 
    // write internal MUXes
    iVar = 0;
    iNext = 2;
    for ( i = 1; i < nPars; i++ )
    {
        if ( i == iNext )
        {
            iNext *= 2;
            iVar++; 
        }
        if ( iVar == nLutSize - 1 )
            fprintf( pFile, ".names i%d p%02d p%02d n%02d\n", iVar, 2*(i-nPars/2), 2*(i-nPars/2)+1, i ); 
        else
            fprintf( pFile, ".names i%d n%02d n%02d n%02d\n", iVar, 2*i, 2*i+1, i ); 
        fprintf( pFile, "01- 1\n" ); 
        fprintf( pFile, "1-1 1\n" ); 
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
}